

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::setSOPIN(Token *this,ByteString *oldPIN,ByteString *newPIN)

{
  _func_int **pp_Var1;
  undefined3 uVar2;
  byte bVar3;
  bool bVar4;
  ByteString *userPINBlob_00;
  SecureDataManager *in_RDI;
  ByteString userPINBlob;
  ByteString soPINBlob;
  bool result;
  SecureDataManager *verifier;
  MutexLocker lock;
  CK_ULONG flags;
  SecureDataManager *in_stack_fffffffffffffe88;
  undefined5 in_stack_fffffffffffffe90;
  byte in_stack_fffffffffffffe95;
  byte in_stack_fffffffffffffe96;
  byte in_stack_fffffffffffffe97;
  undefined7 in_stack_fffffffffffffec8;
  SecureDataManager *in_stack_fffffffffffffed8;
  undefined1 local_100 [40];
  undefined1 local_d8 [46];
  byte local_aa;
  undefined1 local_a9;
  ByteString *local_58;
  undefined4 local_3c;
  undefined2 local_28;
  byte bStack_26;
  undefined5 uStack_25;
  CK_RV local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             (Mutex *)in_stack_fffffffffffffe88);
  if ((in_RDI->userEncryptedKey).byteString.
      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    local_8 = 5;
    local_3c = 1;
  }
  else {
    pp_Var1 = (in_RDI->userEncryptedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type._vptr_SecureAllocator;
    bVar3 = (**(code **)(*pp_Var1 + 0x20))(pp_Var1,&local_28);
    if ((bVar3 & 1) == 0) {
      softHSMLog(3,"setSOPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x10a,"Could not get the token flags");
      local_8 = 5;
      local_3c = 1;
    }
    else {
      userPINBlob_00 = (ByteString *)operator_new(0xd0);
      local_a9 = 1;
      SecureDataManager::getSOPINBlob(in_stack_fffffffffffffe88);
      SecureDataManager::getUserPINBlob(in_stack_fffffffffffffe88);
      SecureDataManager::SecureDataManager
                (in_RDI,(ByteString *)CONCAT17(bVar3,in_stack_fffffffffffffec8),userPINBlob_00);
      local_a9 = 0;
      ByteString::~ByteString((ByteString *)0x1ed926);
      ByteString::~ByteString((ByteString *)0x1ed933);
      local_58 = userPINBlob_00;
      local_aa = SecureDataManager::loginSO
                           ((SecureDataManager *)
                            CONCAT17(in_stack_fffffffffffffe97,
                                     CONCAT16(in_stack_fffffffffffffe96,
                                              CONCAT15(in_stack_fffffffffffffe95,
                                                       in_stack_fffffffffffffe90))),
                            (ByteString *)in_stack_fffffffffffffe88);
      if (local_58 != (ByteString *)0x0) {
        (*local_58->_vptr_ByteString[1])();
      }
      if ((local_aa & 1) == 0) {
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        uVar2 = CONCAT12(bStack_26,local_28);
        bStack_26 = bStack_26 | 0x10;
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_25,uVar2) | 0x100000);
        local_8 = 0xa0;
        local_3c = 1;
      }
      else {
        bVar4 = SecureDataManager::setSOPIN(in_stack_fffffffffffffed8,(ByteString *)in_RDI);
        if (bVar4) {
          pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Tp_alloc_type._vptr_SecureAllocator;
          SecureDataManager::getSOPINBlob(in_stack_fffffffffffffe88);
          bVar3 = (**(code **)*pp_Var1)(pp_Var1,local_d8);
          ByteString::~ByteString((ByteString *)0x1edaf5);
          if ((bVar3 & 1) == 0) {
            local_8 = 5;
            local_3c = 1;
          }
          else {
            ByteString::ByteString((ByteString *)0x1edb4a);
            ByteString::ByteString((ByteString *)0x1edb56);
            pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Tp_alloc_type._vptr_SecureAllocator;
            in_stack_fffffffffffffe97 = (**(code **)(*pp_Var1 + 8))(pp_Var1,local_100);
            in_stack_fffffffffffffe96 = 0;
            if ((in_stack_fffffffffffffe97 & 1) != 0) {
              pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                        super__Tp_alloc_type._vptr_SecureAllocator;
              in_stack_fffffffffffffe95 =
                   (**(code **)(*pp_Var1 + 0x18))(pp_Var1,&stack0xfffffffffffffed8);
              in_stack_fffffffffffffe96 = in_stack_fffffffffffffe95;
            }
            *(byte *)&(in_RDI->userEncryptedKey)._vptr_ByteString = in_stack_fffffffffffffe96 & 1;
            pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                      super__Tp_alloc_type._vptr_SecureAllocator;
            uVar2 = CONCAT12(bStack_26,local_28);
            bStack_26 = bStack_26 & 0xef;
            (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_25,uVar2) & 0xffffffffffefffff);
            local_8 = 0;
            local_3c = 1;
            ByteString::~ByteString((ByteString *)0x1edc05);
            ByteString::~ByteString((ByteString *)0x1edc0f);
          }
        }
        else {
          local_8 = 5;
          local_3c = 1;
        }
      }
    }
  }
  MutexLocker::~MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))));
  return local_8;
}

Assistant:

CK_RV Token::setSOPIN(ByteString& oldPIN, ByteString& newPIN)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Verify oldPIN
	SecureDataManager* verifier = new SecureDataManager(sdm->getSOPINBlob(), sdm->getUserPINBlob());
	bool result = verifier->loginSO(oldPIN);
	delete verifier;
	if (result == false)
	{
		flags |= CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	if (sdm->setSOPIN(newPIN) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setSOPIN(sdm->getSOPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	flags &= ~CKF_SO_PIN_COUNT_LOW;
	token->setTokenFlags(flags);

	return CKR_OK;
}